

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall
mkvmuxer::Cluster::AddFrameWithAdditional
          (Cluster *this,uint8_t *data,uint64_t length,uint8_t *additional,
          uint64_t additional_length,uint64_t add_id,uint64_t track_number,uint64_t abs_timecode,
          bool is_key)

{
  bool bVar1;
  long in_RCX;
  uint64_t in_RDI;
  long in_R8;
  uint64_t in_stack_00000008;
  Frame *in_stack_00000010;
  byte in_stack_00000018;
  undefined7 in_stack_00000019;
  Frame frame;
  Frame *in_stack_ffffffffffffff40;
  Frame *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  Frame *in_stack_ffffffffffffff58;
  bool local_1;
  
  if ((in_RCX == 0) || (in_R8 == 0)) {
    local_1 = false;
  }
  else {
    Frame::Frame((Frame *)&stack0xffffffffffffff58);
    bVar1 = Frame::Init(in_stack_ffffffffffffff48,(uint8_t *)in_stack_ffffffffffffff40,in_RDI);
    if ((bVar1) &&
       (bVar1 = Frame::AddAdditionalData
                          (in_stack_ffffffffffffff58,
                           (uint8_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                           (uint64_t)in_stack_ffffffffffffff48,(uint64_t)in_stack_ffffffffffffff40),
       bVar1)) {
      Frame::set_track_number((Frame *)&stack0xffffffffffffff58,in_stack_00000008);
      Frame::set_timestamp((Frame *)&stack0xffffffffffffff58,(uint64_t)in_stack_00000010);
      Frame::set_is_key((Frame *)&stack0xffffffffffffff58,(bool)(in_stack_00000018 & 1));
      local_1 = QueueOrWriteFrame((Cluster *)CONCAT71(in_stack_00000019,in_stack_00000018),
                                  in_stack_00000010);
    }
    else {
      local_1 = false;
    }
    Frame::~Frame(in_stack_ffffffffffffff40);
  }
  return local_1;
}

Assistant:

bool Cluster::AddFrameWithAdditional(const uint8_t* data, uint64_t length,
                                     const uint8_t* additional,
                                     uint64_t additional_length,
                                     uint64_t add_id, uint64_t track_number,
                                     uint64_t abs_timecode, bool is_key) {
  if (!additional || additional_length == 0) {
    return false;
  }
  Frame frame;
  if (!frame.Init(data, length) ||
      !frame.AddAdditionalData(additional, additional_length, add_id)) {
    return false;
  }
  frame.set_track_number(track_number);
  frame.set_timestamp(abs_timecode);
  frame.set_is_key(is_key);
  return QueueOrWriteFrame(&frame);
}